

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

uint32_t inform_dist_tick(inform_dist *dist,size_t event)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if ((dist != (inform_dist *)0x0) && (uVar1 = 0, event < dist->size)) {
    dist->counts = dist->counts + 1;
    uVar1 = dist->histogram[event] + 1;
    dist->histogram[event] = uVar1;
  }
  return uVar1;
}

Assistant:

uint32_t inform_dist_tick(inform_dist *dist, size_t event)
{
    // if the distribution is NULL or the event is outsize of the support
    if (dist == NULL || event >= dist->size)
    {
        return 0;
    }
    // increment counts by one
    dist->counts += 1;
    // increment by one and return the new number of occurances of the event
    return (dist->histogram[event] += 1);
}